

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rcore.c
# Opt level: O1

long GetFileModTime(char *fileName)

{
  int iVar1;
  long lVar2;
  stat_conflict result;
  stat sStack_a8;
  
  memset(&sStack_a8,0,0x90);
  iVar1 = stat(fileName,&sStack_a8);
  lVar2 = 0;
  if (iVar1 == 0) {
    lVar2 = sStack_a8.st_mtim.tv_sec;
  }
  return lVar2;
}

Assistant:

long GetFileModTime(const char *fileName)
{
    struct stat result = { 0 };
    long modTime = 0;

    if (stat(fileName, &result) == 0)
    {
        time_t mod = result.st_mtime;

        modTime = (long)mod;
    }

    return modTime;
}